

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<float,int,long_double>
                 (size_t col_num,size_t nrows,float *Xc,int *Xc_ind,int *Xc_indptr,
                 MissingAction missing_action,float *w)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  double in_XMM0_Qa;
  double __value;
  double extraout_XMM0_Qa;
  double dVar11;
  double extraout_XMM0_Qa_00;
  double __value_00;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  long in_stack_00000008;
  longdouble out;
  longdouble v;
  longdouble sn;
  int ix_2;
  int ix_1;
  longdouble xval;
  int ix;
  longdouble cnt;
  longdouble w_this;
  longdouble x_sq;
  longdouble s4;
  longdouble s3;
  longdouble s2;
  longdouble s1;
  MissingAction in_stack_fffffffffffffea4;
  float *in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb2;
  int *in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec2;
  size_t in_stack_fffffffffffffec8;
  byte local_121;
  int local_d0;
  int local_cc;
  int local_ac;
  longdouble local_a8;
  longdouble local_78;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  double local_8;
  
  if (*(int *)(in_R8 + in_RDI * 4) == *(int *)(in_R8 + 4 + in_RDI * 4)) {
    local_8 = -INFINITY;
  }
  else {
    local_78 = (longdouble)0;
    lVar5 = in_RSI - (*(int *)(in_R8 + 4 + in_RDI * 4) - *(int *)(in_R8 + in_RDI * 4));
    local_a8 = (longdouble)(float)(&DAT_006c0110)[lVar5 < 0] + (longdouble)lVar5;
    for (local_ac = *(int *)(in_R8 + in_RDI * 4); local_ac < *(int *)(in_R8 + 4 + in_RDI * 4);
        local_ac = local_ac + 1) {
      local_a8 = local_a8 +
                 (longdouble)
                 *(float *)(in_stack_00000008 + (long)*(int *)(in_RCX + (long)local_ac * 4) * 4);
    }
    if (local_a8 <= (longdouble)0) {
      local_8 = -INFINITY;
    }
    else {
      if (in_R9D == 0) {
        local_68 = local_78;
        local_58 = local_78;
        local_48 = local_78;
        for (local_d0 = *(int *)(in_R8 + in_RDI * 4); lVar7 = in_ST3, lVar8 = in_ST2,
            lVar10 = in_ST1, lVar9 = in_ST0, local_d0 < *(int *)(in_R8 + 4 + in_RDI * 4);
            local_d0 = local_d0 + 1) {
          lVar6 = (longdouble)*(float *)(in_RDX + (long)local_d0 * 4);
          lVar6 = lVar6 * lVar6;
          in_ST1 = in_ST4;
          dVar11 = std::fma(in_XMM0_Qa,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
          in_ST2 = in_ST1;
          dVar11 = std::fma(dVar11,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
          in_ST3 = in_ST2;
          dVar11 = std::fma(dVar11,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
          lVar6 = lVar6 * lVar6;
          in_stack_fffffffffffffeb8 = SUB108(local_78,0);
          in_stack_fffffffffffffec0 = (undefined2)((unkuint10)local_78 >> 0x40);
          in_stack_fffffffffffffea8 = SUB108(lVar6,0);
          in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)lVar6 >> 0x40);
          lVar6 = in_ST3;
          in_XMM0_Qa = std::fma(dVar11,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
          in_ST0 = in_ST4;
          in_ST4 = lVar6;
          local_78 = lVar7;
          local_68 = lVar8;
          local_58 = lVar10;
          local_48 = lVar9;
        }
      }
      else {
        local_68 = local_78;
        local_58 = local_78;
        local_48 = local_78;
        for (local_cc = *(int *)(in_R8 + in_RDI * 4); local_cc < *(int *)(in_R8 + 4 + in_RDI * 4);
            local_cc = local_cc + 1) {
          fVar1 = *(float *)(in_stack_00000008 + (long)*(int *)(in_RCX + (long)local_cc * 4) * 4);
          lVar6 = (longdouble)*(float *)(in_RDX + (long)local_cc * 4);
          uVar3 = std::isnan(in_XMM0_Qa);
          local_121 = 1;
          lVar9 = in_ST0;
          lVar10 = in_ST1;
          lVar8 = in_ST2;
          lVar7 = in_ST3;
          in_XMM0_Qa = __value;
          if ((uVar3 & 1) == 0) {
            iVar4 = std::isinf(__value);
            local_121 = (byte)iVar4;
            lVar9 = in_ST0;
            lVar10 = in_ST1;
            lVar8 = in_ST2;
            lVar7 = in_ST3;
            in_XMM0_Qa = extraout_XMM0_Qa;
          }
          if ((local_121 & 1) == 0) {
            lVar6 = lVar6 * lVar6;
            in_ST1 = in_ST4;
            dVar11 = std::fma(in_XMM0_Qa,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_ST2 = in_ST1;
            dVar11 = std::fma(dVar11,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_ST3 = in_ST2;
            dVar11 = std::fma(dVar11,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            lVar6 = lVar6 * lVar6;
            in_stack_fffffffffffffeb8 = SUB108(local_78,0);
            in_stack_fffffffffffffec0 = (undefined2)((unkuint10)local_78 >> 0x40);
            in_stack_fffffffffffffea8 = SUB108(lVar6,0);
            in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)lVar6 >> 0x40);
            lVar6 = in_ST3;
            in_XMM0_Qa = std::fma(dVar11,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_ST0 = in_ST4;
            in_ST4 = lVar6;
            local_78 = lVar7;
            local_68 = lVar8;
            local_58 = lVar10;
            local_48 = lVar9;
          }
          else {
            local_a8 = local_a8 - (longdouble)fVar1;
            in_ST0 = lVar9;
            in_ST1 = lVar10;
            in_ST2 = lVar8;
            in_ST3 = lVar7;
          }
        }
        if (local_a8 <= (longdouble)0) {
          return -INFINITY;
        }
      }
      bVar2 = true;
      if ((longdouble)1 < local_a8) {
        bVar2 = true;
        if ((local_58 != (longdouble)0) || (NAN(local_58) || NAN((longdouble)0))) {
          bVar2 = local_48 * local_48 == local_58;
        }
      }
      if (bVar2) {
        local_8 = -INFINITY;
      }
      else {
        lVar9 = local_48 / local_a8;
        lVar10 = local_58 / local_a8 - lVar9 * lVar9;
        uVar3 = std::isnan(in_XMM0_Qa);
        if ((uVar3 & 1) == 0) {
          dVar11 = std::numeric_limits<double>::epsilon();
          if (((longdouble)dVar11 < lVar10) ||
             (bVar2 = check_more_than_two_unique_values<float,int>
                                (in_stack_fffffffffffffec8,
                                 CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0),
                                 in_stack_fffffffffffffeb8,
                                 (int *)CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0
                                                ),in_stack_fffffffffffffea8,
                                 in_stack_fffffffffffffea4), dVar11 = extraout_XMM0_Qa_00, bVar2)) {
            if (lVar10 <= (longdouble)0) {
              local_8 = -INFINITY;
            }
            else {
              lVar8 = lVar9 * lVar9 * lVar9;
              uVar3 = std::isnan(dVar11);
              if (((uVar3 & 1) == 0) && (uVar3 = std::isinf(__value_00), (uVar3 & 1) == 0)) {
                local_8 = (double)((lVar8 * lVar9 * local_a8 +
                                   (((longdouble)6.0 * local_58 * lVar9 * lVar9 +
                                    (local_78 - local_68 * (longdouble)4.0 * lVar9)) -
                                   local_48 * (longdouble)4.0 * lVar8)) /
                                  (lVar10 * lVar10 * local_a8));
                if (local_8 <= 0.0) {
                  local_8 = 0.0;
                }
              }
              else {
                local_8 = -INFINITY;
              }
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(size_t col_num, size_t nrows,
                              real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, real_t *restrict w)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = nrows - (Xc_indptr[col_num + 1] - Xc_indptr[col_num]);
    for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        cnt += w[Xc_ind[ix]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            if (unlikely(is_na_or_inf(xval)))
            {
                cnt -= w_this;
            }

            else
            {
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);
            }
        }

        if (cnt <= 0) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            x_sq = xval * xval;
            s1 = std::fma(w_this, xval, s1);
            s2 = std::fma(w_this, x_sq, s2);
            s3 = std::fma(w_this, x_sq*xval, s3);
            s4 = std::fma(w_this, x_sq*x_sq, s4);
            // s1 += w_this * pw1(xval);
            // s2 += w_this * pw2(xval);
            // s3 += w_this * pw3(xval);
            // s4 += w_this * pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return -HUGE_VAL;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}